

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  int iVar1;
  Dim DVar2;
  StorageClass SVar3;
  uint id;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  BuiltIn builtin;
  uint32_t uVar7;
  SPIRVariable *pSVar8;
  SPIRType *pSVar9;
  SPIRType *pSVar10;
  SPIRType *pSVar11;
  size_type sVar12;
  char *pcVar13;
  size_type sVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char (*ts_1_00) [2];
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  byte bVar15;
  undefined7 in_register_00000089;
  bool bVar16;
  uint32_t local_dc;
  string array_size_decl;
  uint32_t array_size;
  undefined4 uStack_b4;
  char *cv_qualifier;
  ulong local_90;
  uint local_84;
  string address_space;
  string local_50;
  
  pSVar8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,(arg->id).id);
  pSVar9 = Compiler::get_variable_data_type((Compiler *)this,pSVar8);
  pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(arg->type).id);
  bVar6 = pSVar10->pointer;
  local_dc = (pSVar8->super_IVariant).self.id;
  bVar16 = arg->alias_global_variable;
  if (bVar16 == true) {
    uVar7 = (pSVar8->basevariable).id;
    if (uVar7 != 0) {
      local_dc = uVar7;
    }
LAB_002fcc5c:
    bVar4 = false;
  }
  else {
    if (bVar6 == false) goto LAB_002fcc5c;
    bVar4 = arg->write_count == 0;
  }
  local_90 = (ulong)pSVar10->storage;
  iVar1 = *(int *)&(pSVar9->super_IVariant).field_0xc;
  DVar2 = (pSVar9->image).dim;
  if ((DVar2 == DimSubpassData && iVar1 == 0x10) &&
     ((this->msl_options).use_framebuffer_fetch_subpasses != false)) {
    bVar4 = false;
  }
  else {
    bVar4 = (bool)(pSVar10->storage == StorageClassUniformConstant | bVar4);
  }
  cv_qualifier = "const ";
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x375a3a;
  if (!bVar4) {
    cv_qualifier = "";
  }
  local_84 = iVar1 - 0x13;
  if (0xfffffffc < local_84) {
    cv_qualifier = "";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar15 = ~bVar16;
  if (((DVar2 == Dim2D & iVar1 == 0x11 & bVar15) == 1) &&
     (pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar9->image).type.id),
     *(int *)&(pSVar11->super_IVariant).field_0xc - 0xcU < 3)) {
    address_space._M_dataplus._M_p._0_1_ = 0x44;
    sVar12 = ::std::
             set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
             ::count(&this->spv_function_implementations,(key_type *)&address_space);
    bVar16 = sVar12 != 0;
  }
  else {
    bVar16 = false;
  }
  get_argument_address_space_abi_cxx11_(&address_space,this,pSVar8);
  bVar4 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,DecorationBuiltIn);
  builtin = Compiler::get_decoration((Compiler *)this,(ID)(arg->id).id,DecorationBuiltIn);
  bVar5 = ::std::operator==(&address_space,"threadgroup");
  if (bVar5) {
    this->is_using_builtin_array = true;
  }
  uVar7 = (pSVar8->basevariable).id;
  if ((uVar7 == 0) ||
     ((uVar7 != (this->stage_in_ptr_var_id).id && (uVar7 != (this->stage_out_ptr_var_id).id)))) {
    if (bVar4) {
      pSVar11 = Compiler::get<spirv_cross::SPIRType>
                          ((Compiler *)this,*(uint32_t *)&(pSVar8->super_IVariant).field_0xc);
      SVar3 = pSVar11->storage;
      if ((builtin - BuiltInTessLevelOuter < 2) && (SVar3 == StorageClassInput)) {
        bVar5 = false;
LAB_002fcde9:
        this->is_using_builtin_array = bVar5;
      }
      else {
        if (builtin - BuiltInVertexId < 0xfffffffe) {
          this->is_using_builtin_array = true;
        }
        if ((SVar3 == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) == 0)) {
          bVar16 = CompilerGLSL::is_stage_output_builtin_masked(&this->super_CompilerGLSL,builtin);
          bVar5 = true;
          if (!bVar16) goto LAB_002fcde9;
        }
      }
      if (this->is_using_builtin_array == true) {
        id = (arg->id).id;
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)id;
        builtin_type_decl_abi_cxx11_((string *)&array_size,this,builtin,id);
        join<char_const*&,std::__cxx11::string>
                  (&array_size_decl,(spirv_cross *)&cv_qualifier,(char **)&array_size,ts_1);
      }
      else {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(arg->id).id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar9);
        join<char_const*&,std::__cxx11::string>
                  (&array_size_decl,(spirv_cross *)&cv_qualifier,(char **)&array_size,ts_1);
      }
      goto LAB_002fcfcb;
    }
    if ((((int)local_90 == 0xc) || ((int)local_90 == 2)) &&
       (bVar5 = Compiler::is_array((Compiler *)this,pSVar9), bVar5)) {
      this->is_using_builtin_array = true;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&array_size,this,pSVar9,(ulong)(arg->id).id);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x385aaf;
      join<char_const*&,std::__cxx11::string,char_const(&)[2]>
                (&array_size_decl,(spirv_cross *)&cv_qualifier,(char **)&array_size,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x385aaf,
                 (char (*) [2])ts_2);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      goto LAB_002fcfe0;
    }
    if (bVar16) {
      pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar9->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar11,0);
      ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x385755;
      join<char_const*&,char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                (&array_size_decl,(spirv_cross *)&cv_qualifier,(char **)"spvDynamicImageSampler<",
                 (char (*) [24])&array_size,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x385755,
                 (char (*) [2])CONCAT71(in_register_00000089,bVar15));
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&array_size_decl)
      ;
      ::std::__cxx11::string::~string((string *)&array_size_decl);
      ::std::__cxx11::string::~string((string *)&array_size);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      Compiler::set_extended_decoration
                ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
      goto LAB_002fcfef;
    }
    bVar16 = type_is_pointer(this,pSVar9);
    if (!bVar16) {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(arg->id).id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar9);
      join<char_const*&,std::__cxx11::string>
                (&array_size_decl,(spirv_cross *)&cv_qualifier,(char **)&array_size,ts_1);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&array_size_decl)
      ;
      goto LAB_002fcfe0;
    }
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size_decl,this,pSVar9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&array_size_decl);
    ::std::__cxx11::string::~string((string *)&array_size_decl);
    if (*cv_qualifier == '\0') goto LAB_002fcfef;
    join<char_const(&)[2],char_const*&>
              (&array_size_decl,(spirv_cross *)0x37fb8c,(char (*) [2])&cv_qualifier,(char **)ts_1);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_00 = &array_size_decl;
  }
  else {
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar9);
    join<char_const*&,std::__cxx11::string>
              (&array_size_decl,(spirv_cross *)&cv_qualifier,(char **)&array_size,ts_1);
LAB_002fcfcb:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&array_size_decl);
LAB_002fcfe0:
    ::std::__cxx11::string::~string((string *)&array_size_decl);
    this_00 = (string *)&array_size;
  }
  ::std::__cxx11::string::~string((string *)this_00);
LAB_002fcfef:
  if (((bVar6 & 1U) != 0 || bVar4) || ((int)local_90 - 9U < 0xfffffffe)) {
    bVar6 = Compiler::is_array((Compiler *)this,pSVar9);
    ts_1_00 = (char (*) [2])CONCAT71((int7)((ulong)ts_1 >> 8),0xfffffffc < local_84);
    if (!bVar6 || 0xfffffffc < local_84) {
      if (local_84 < 0xfffffffd) {
        array_size_decl._M_dataplus._M_p._0_4_ = (pSVar8->basevariable).id;
        sVar14 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->pull_model_inputs)._M_h,(key_type *)&array_size_decl);
        if ((sVar14 == 0) || (*(int *)&(pSVar9->super_IVariant).field_0xc == 0xf)) {
          if (address_space._M_string_length != 0) {
            bVar6 = type_is_pointer(this,pSVar9);
            if (bVar6) {
              if (*cv_qualifier == '\0') {
                ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
              }
              join<std::__cxx11::string&,char_const(&)[2]>
                        (&array_size_decl,(spirv_cross *)&address_space,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x37fb8c,ts_1_00);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            else {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                        (&array_size_decl,(spirv_cross *)&address_space,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x37fb8c,(char (*) [2])__return_storage_ptr__,ts_2);
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)&array_size_decl);
            }
            ::std::__cxx11::string::~string((string *)&array_size_decl);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_restrict(this,local_dc,true);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&array_size_decl,&this->super_CompilerGLSL,local_dc,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          if (address_space._M_string_length != 0) {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      (&array_size_decl,(spirv_cross *)&address_space,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c
                       ,(char (*) [2])__return_storage_ptr__,ts_2);
            ::std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&array_size_decl);
            ::std::__cxx11::string::~string((string *)&array_size_decl);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&array_size_decl,&this->super_CompilerGLSL,local_dc,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
      }
      else if ((pSVar9->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_
                  (&array_size_decl,&this->super_CompilerGLSL,local_dc,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        _array_size = descriptor_address_space(this,local_dc,(StorageClass)local_90,"thread const");
        join<char_const*&,char_const(&)[2],std::__cxx11::string&>
                  (&array_size_decl,(spirv_cross *)&array_size,(char **)0x37fb8c,
                   (char (*) [2])__return_storage_ptr__,ts_2);
        ::std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,(string *)&array_size_decl);
        ::std::__cxx11::string::~string((string *)&array_size_decl);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_
                  (&array_size_decl,&this->super_CompilerGLSL,local_dc,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
    }
    else {
      if (address_space._M_string_length != 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&array_size_decl,(spirv_cross *)&address_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                   (char (*) [2])__return_storage_ptr__,ts_2);
        ::std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,(string *)&array_size_decl);
        ::std::__cxx11::string::~string((string *)&array_size_decl);
      }
      pcVar13 = descriptor_address_space(this,local_dc,(StorageClass)local_90,(char *)0x0);
      if (pcVar13 != (char *)0x0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      bVar6 = is_tesc_shader(this);
      if (bVar4 && (builtin - BuiltInTessLevelOuter < 2 && bVar6)) {
        uVar7 = get_physical_tess_level_array_size(this,builtin);
        array_size = uVar7;
        if (uVar7 == 1) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&array_size_decl,&this->super_CompilerGLSL,local_dc,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&array_size_decl,&this->super_CompilerGLSL,local_dc,true);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&array_size_decl);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (&array_size_decl,(spirv_cross *)0x37d448,(char (*) [2])&array_size,
                     (uint *)0x3759d6,(char (*) [2])ts_2);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])
                  (&array_size_decl,this,pSVar9);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        pcVar13 = to_restrict(this,local_dc,true);
        if (*pcVar13 != '\0') {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&array_size,&this->super_CompilerGLSL,local_dc,true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&array_size);
        if (array_size_decl._M_string_length != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
      }
    }
  }
  else if (((this->msl_options).force_native_arrays == true) &&
          (bVar6 = Compiler::is_array((Compiler *)this,pSVar9), bVar6)) {
    ::std::__cxx11::string::string((string *)&array_size,"thread const ",(allocator *)&local_50);
    ::std::operator+(&array_size_decl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &array_size,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&array_size_decl);
    ::std::__cxx11::string::~string((string *)&array_size_decl);
    ::std::__cxx11::string::~string((string *)&array_size);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar13 = to_restrict(this,local_dc,true);
    if (*pcVar13 != '\0') {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&array_size_decl,&this->super_CompilerGLSL,local_dc,true)
    ;
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&array_size_decl);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(&array_size_decl,this,pSVar9);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    if (address_space._M_string_length != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&array_size_decl,(spirv_cross *)&address_space,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                 (char (*) [2])__return_storage_ptr__,ts_2);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&array_size_decl)
      ;
      ::std::__cxx11::string::~string((string *)&array_size_decl);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    CompilerGLSL::to_expression_abi_cxx11_(&array_size_decl,&this->super_CompilerGLSL,local_dc,true)
    ;
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)&array_size_decl);
  pSVar8 = Compiler::maybe_get_backing_variable((Compiler *)this,local_dc);
  if (pSVar8 != (SPIRVariable *)0x0) {
    array_size_decl._M_dataplus._M_p._0_4_ = (pSVar8->super_IVariant).self.id;
    sVar14 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->atomic_image_vars)._M_h,(key_type *)&array_size_decl);
    if (sVar14 != 0) {
      pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar10->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar9,0);
      ::std::operator+(&array_size_decl,", device atomic_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_size);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&array_size_decl);
      ::std::__cxx11::string::~string((string *)&array_size);
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_dc,true);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_size,"* ",&local_50);
      ::std::operator+(&array_size_decl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_size,"_atomic");
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&array_size_decl);
      ::std::__cxx11::string::~string((string *)&array_size);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  this->is_using_builtin_array = false;
  ::std::__cxx11::string::~string((string *)&address_space);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &type = get_variable_data_type(var);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass type_storage = var_type.storage;
	bool is_pointer = var_type.pointer;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && is_pointer && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;
	else if (type_storage == StorageClassUniformConstant)
		constref = true;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;

	// For opaque types we handle const later due to descriptor address spaces.
	const char *cv_qualifier = (constref && !type_is_image) ? "const " : "";
	string decl;

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = has_decoration(var.self, DecorationBuiltIn);
	auto builtin_type = BuiltIn(get_decoration(arg.id, DecorationBuiltIn));

	if (address_space == "threadgroup")
		is_using_builtin_array = true;

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	else if (builtin)
	{
		// Only use templated array for Clip/Cull distance when feasible.
		// In other scenarios, we need need to override array length for tess levels (if used as outputs),
		// or we need to emit the expected type for builtins (uint vs int).
		auto storage = get<SPIRType>(var.basetype).storage;

		if (storage == StorageClassInput &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			is_using_builtin_array = false;
		}
		else if (builtin_type != BuiltInClipDistance && builtin_type != BuiltInCullDistance)
		{
			is_using_builtin_array = true;
		}

		if (storage == StorageClassOutput && variable_storage_requires_stage_io(storage) &&
		    !is_stage_output_builtin_masked(builtin_type))
			is_using_builtin_array = true;

		if (is_using_builtin_array)
			decl = join(cv_qualifier, builtin_type_decl(builtin_type, arg.id));
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}
	else if ((type_storage == StorageClassUniform || type_storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(cv_qualifier, type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl = join(cv_qualifier, "spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
	{
		// The type is a pointer type we need to emit cv_qualifier late.
		if (type_is_pointer(type))
		{
			decl = type_to_glsl(type, arg.id);
			if (*cv_qualifier != '\0')
				decl += join(" ", cv_qualifier);
		}
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}

	if (!builtin && !is_pointer &&
	    (type_storage == StorageClassFunction || type_storage == StorageClassGeneric))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of opaque types are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		const char *argument_buffer_space = descriptor_address_space(name_id, type_storage, nullptr);
		if (argument_buffer_space)
		{
			decl += " ";
			decl += argument_buffer_space;
		}

		// Special case, need to override the array size here if we're using tess level as an argument.
		if (is_tesc_shader() && builtin &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin_type);
			if (array_size == 1)
			{
				decl += " &";
				decl += to_expression(name_id);
			}
			else
			{
				decl += " (&";
				decl += to_expression(name_id);
				decl += ")";
				decl += join("[", array_size, "]");
			}
		}
		else
		{
			auto array_size_decl = type_to_array_glsl(type);
			if (array_size_decl.empty())
				decl += "& ";
			else
				decl += " (&";

			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);

			if (!array_size_decl.empty())
			{
				decl += ")";
				decl += array_size_decl;
			}
		}
	}
	else if (!type_is_image && (!pull_model_inputs.count(var.basevariable) || type.basetype == SPIRType::Struct))
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (type_is_pointer(type))
			{
				if (*cv_qualifier == '\0')
					decl += ' ';
				decl += join(address_space, " ");
			}
			else
				decl = join(address_space, " ", decl);
		}
		decl += "&";
		decl += " ";
		decl += to_restrict(name_id, true);
		decl += to_expression(name_id);
	}
	else if (type_is_image)
	{
		if (type.array.empty())
		{
			// For non-arrayed types we can just pass opaque descriptors by value.
			// This fixes problems if descriptors are passed by value from argument buffers and plain descriptors
			// in same shader.
			// There is no address space we can actually use, but value will work.
			// This will break if applications attempt to pass down descriptor arrays as arguments, but
			// fortunately that is extremely unlikely ...
			decl += " ";
			decl += to_expression(name_id);
		}
		else
		{
			const char *img_address_space = descriptor_address_space(name_id, type_storage, "thread const");
			decl = join(img_address_space, " ", decl);
			decl += "& ";
			decl += to_expression(name_id);
		}
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		decl += ", device atomic_" + type_to_glsl(get<SPIRType>(var_type.image.type), 0);
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}